

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O0

bool __thiscall
ON_UuidIndexList::AddUuidIndex
          (ON_UuidIndexList *this,ON_UUID uuid,int index,bool bCheckForDupicates)

{
  bool bVar1;
  ON_UuidIndex *pOVar2;
  byte local_49;
  ON_UuidIndex *ui;
  bool local_26;
  bool rc;
  bool bCheckForDupicates_local;
  int index_local;
  ON_UuidIndexList *this_local;
  ON_UUID uuid_local;
  
  uuid_local._0_8_ = uuid.Data4;
  this_local = uuid._0_8_;
  if (bCheckForDupicates) {
    bVar1 = FindUuid(this,uuid,(int *)0x0);
    local_49 = bVar1 ^ 0xff;
  }
  else {
    local_49 = 1;
  }
  local_26 = (bool)(local_49 & 1);
  if (local_26 != false) {
    bVar1 = ::operator==(&ON_max_uuid,(ON_UUID_struct *)&this_local);
    if (bVar1) {
      local_26 = false;
    }
    else {
      pOVar2 = ON_SimpleArray<ON_UuidIndex>::AppendNew(&this->super_ON_SimpleArray<ON_UuidIndex>);
      *(ON_UuidIndexList **)&pOVar2->m_id = this_local;
      *(undefined8 *)(pOVar2->m_id).Data4 = uuid_local._0_8_;
      pOVar2->m_i = index;
    }
  }
  return local_26;
}

Assistant:

bool ON_UuidIndexList::AddUuidIndex(ON_UUID uuid, int index, bool bCheckForDupicates)
{
  bool rc = bCheckForDupicates ? !FindUuid(uuid,nullptr) : true;
  if (rc)
  {
    if ( ON_max_uuid == uuid )
      rc = 0;
    else
    {
      ON_UuidIndex& ui = AppendNew();
      ui.m_id = uuid;
      ui.m_i = index;
    }
  }
  return rc;
}